

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O1

void __thiscall CPU::MOS6502::State::Inputs::Inputs(Inputs *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_30;
  
  (this->super_StructImpl<CPU::MOS6502::State::Inputs>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__005a99f0;
  if (Reflection::StructImpl<CPU::MOS6502::State::Inputs>::contents__abi_cxx11_._M_h.
      _M_element_count == 0) {
    paVar1 = &local_30.field_2;
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ready","");
    Reflection::StructImpl<CPU::MOS6502::State::Inputs>::declare_emplace<bool>
              (&this->super_StructImpl<CPU::MOS6502::State::Inputs>,&this->ready,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"irq","");
    Reflection::StructImpl<CPU::MOS6502::State::Inputs>::declare_emplace<bool>
              (&this->super_StructImpl<CPU::MOS6502::State::Inputs>,&this->irq,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"nmi","");
    Reflection::StructImpl<CPU::MOS6502::State::Inputs>::declare_emplace<bool>
              (&this->super_StructImpl<CPU::MOS6502::State::Inputs>,&this->nmi,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"reset","");
    Reflection::StructImpl<CPU::MOS6502::State::Inputs>::declare_emplace<bool>
              (&this->super_StructImpl<CPU::MOS6502::State::Inputs>,&this->reset,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

State::Inputs::Inputs() {
	if(needs_declare()) {
		DeclareField(ready);
		DeclareField(irq);
		DeclareField(nmi);
		DeclareField(reset);
	}
}